

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::SListIntermediateNode::SListIntermediateNode
          (SListIntermediateNode *this,TermList ts,uint childVar)

{
  Node *pNVar1;
  long lVar2;
  
  (this->super_IntermediateNode).super_Node._term._content = ts._content;
  (this->super_IntermediateNode).childVar = childVar;
  (this->super_IntermediateNode).super_Node._vptr_Node =
       (_func_int **)&PTR__SListIntermediateNode_00b54348;
  pNVar1 = (Node *)::operator_new(0x110,0x10);
  (this->_nodes)._left = pNVar1;
  (this->_nodes)._top = 0;
  lVar2 = 0x100;
  do {
    *(undefined8 *)((long)((this->_nodes)._left)->nodes + lVar2 + -8) = 0;
    lVar2 = lVar2 + -8;
  } while (lVar2 != 0);
  return;
}

Assistant:

SListIntermediateNode(TermList ts, unsigned childVar) : IntermediateNode(ts, childVar) {}